

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

void __thiscall HEkk::debugReportInitialBasis(HEkk *this)

{
  double dVar1;
  HighsLogOptions *pHVar2;
  value_type vVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  reference pvVar7;
  reference pvVar8;
  uint uVar9;
  long in_RDI;
  HighsInt num_row_nonbasic;
  HighsInt num_col_nonbasic;
  HighsInt iVar_1;
  HighsInt iRow;
  HighsInt iVar;
  HighsInt iCol;
  bool detail;
  vector<double,_std::allocator<double>_> *value;
  vector<double,_std::allocator<double>_> *upper;
  vector<double,_std::allocator<double>_> *lower;
  HighsInt num_row_free;
  HighsInt num_row_fixed;
  HighsInt num_row_upper;
  HighsInt num_row_lower;
  HighsInt num_row_basic;
  HighsInt num_col_free;
  HighsInt num_col_fixed;
  HighsInt num_col_upper;
  HighsInt num_col_lower;
  HighsInt num_col_basic;
  uint local_88;
  uint local_80;
  int local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_60 = 0;
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x25a8);
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x25c0);
  bVar5 = *(int *)(in_RDI + 0x2198) + *(int *)(in_RDI + 0x219c) < 0x19;
  for (local_80 = 0; (int)local_80 < *(int *)(in_RDI + 0x2198); local_80 = local_80 + 1) {
    pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)(int)local_80);
    if (*pvVar7 == '\0') {
      local_3c = local_3c + 1;
    }
    else {
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                          (long)(int)local_80);
      if (*pvVar7 < '\x01') {
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                            (long)(int)local_80);
        if (*pvVar7 < '\0') {
          local_44 = local_44 + 1;
        }
        else {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (this_00,(long)(int)local_80);
          dVar1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (this_01,(long)(int)local_80);
          if ((dVar1 != *pvVar8) || (NAN(dVar1) || NAN(*pvVar8))) {
            local_4c = local_4c + 1;
          }
          else {
            local_48 = local_48 + 1;
          }
        }
      }
      else {
        local_40 = local_40 + 1;
      }
      if (bVar5) {
        lVar4 = *(long *)(in_RDI + 8);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)(int)local_80);
        pHVar2 = (HighsLogOptions *)*pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                            (long)(int)local_80);
        vVar3 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_01,(long)(int)local_80);
        highsLogDev(pHVar2,(HighsLogType)vVar3,(char *)*pvVar8,lVar4 + 0x380,1,
                    "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",(ulong)local_80,
                    (ulong)local_40,(ulong)local_44,local_48,local_4c);
      }
    }
  }
  for (local_88 = 0; (int)local_88 < *(int *)(in_RDI + 0x219c); local_88 = local_88 + 1) {
    iVar6 = *(int *)(in_RDI + 0x2198) + local_88;
    pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)iVar6);
    if (*pvVar7 == '\0') {
      local_50 = local_50 + 1;
    }
    else {
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                          (long)iVar6);
      if (*pvVar7 < '\x01') {
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8),
                            (long)iVar6);
        if (*pvVar7 < '\0') {
          local_58 = local_58 + 1;
        }
        else {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar6);
          dVar1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar6);
          if ((dVar1 != *pvVar8) || (NAN(dVar1) || NAN(*pvVar8))) {
            local_60 = local_60 + 1;
          }
          else {
            local_5c = local_5c + 1;
          }
        }
      }
      else {
        local_54 = local_54 + 1;
      }
      if (bVar5) {
        lVar4 = *(long *)(in_RDI + 8);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar6);
        pHVar2 = (HighsLogOptions *)*pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),(long)iVar6
                           );
        vVar3 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar6);
        highsLogDev(pHVar2,(HighsLogType)vVar3,(char *)*pvVar8,lVar4 + 0x380,1,
                    "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",(ulong)local_88,
                    (ulong)local_54,(ulong)local_58,local_5c,local_60);
      }
    }
  }
  uVar9 = local_40 + local_44 + local_48 + local_4c;
  iVar6 = local_54 + local_58 + local_5c + local_60;
  highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kInfo,
              "For %d columns and %d rows\n   NonBasic |  Lower  Upper  Fixed   Free |    Basic\nCol %7d |%7d%7d%7d%7d |  %7d\nRow %7d |%7d%7d%7d%7d |  %7d\n----------------------------------------------------\n    %7d |%7d%7d%7d%7d |  %7d\n"
              ,(ulong)*(uint *)(in_RDI + 0x2198),(ulong)*(uint *)(in_RDI + 0x219c),(ulong)uVar9,
              local_40,local_44,local_48,local_4c,local_3c,iVar6,local_54,local_58,local_5c,local_60
              ,local_50,uVar9 + iVar6,local_40 + local_54,local_44 + local_58,local_48 + local_5c,
              local_4c + local_60,local_3c + local_50);
  return;
}

Assistant:

void HEkk::debugReportInitialBasis() {
  HighsInt num_col_basic = 0;
  HighsInt num_col_lower = 0;
  HighsInt num_col_upper = 0;
  HighsInt num_col_fixed = 0;
  HighsInt num_col_free = 0;
  HighsInt num_row_basic = 0;
  HighsInt num_row_lower = 0;
  HighsInt num_row_upper = 0;
  HighsInt num_row_fixed = 0;
  HighsInt num_row_free = 0;
  std::vector<double>& lower = info_.workLower_;
  std::vector<double>& upper = info_.workUpper_;
  std::vector<double>& value = info_.workValue_;
  const bool detail = lp_.num_col_ + lp_.num_row_ < 25;
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    HighsInt iVar = iCol;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_col_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_col_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_col_upper++;
    } else if (lower[iCol] == upper[iCol]) {
      num_col_fixed++;
    } else {
      num_col_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iCol, lower[iCol], value[iVar], upper[iCol],
                  num_col_lower, num_col_upper, num_col_fixed, num_col_free);
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = lp_.num_col_ + iRow;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_row_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_row_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_row_upper++;
    } else if (lower[iVar] == upper[iVar]) {
      num_row_fixed++;
    } else {
      num_row_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iRow, lower[iVar], value[iVar], upper[iVar],
                  num_row_lower, num_row_upper, num_row_fixed, num_row_free);
  }
  HighsInt num_col_nonbasic =
      num_col_lower + num_col_upper + num_col_fixed + num_col_free;
  HighsInt num_row_nonbasic =
      num_row_lower + num_row_upper + num_row_fixed + num_row_free;
  assert(num_col_basic + num_row_basic == lp_.num_row_);
  assert(num_col_nonbasic + num_row_nonbasic == lp_.num_col_);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "For %d columns and %d rows\n"
              "   NonBasic |  Lower  Upper  Fixed   Free |    Basic\n"
              "Col %7d |%7d%7d%7d%7d |  %7d\n"
              "Row %7d |%7d%7d%7d%7d |  %7d\n"
              "----------------------------------------------------\n"
              "    %7d |%7d%7d%7d%7d |  %7d\n",
              (int)lp_.num_col_, (int)lp_.num_row_, (int)num_col_nonbasic,
              (int)num_col_lower, (int)num_col_upper, (int)num_col_fixed,
              (int)num_col_free, (int)num_col_basic, (int)num_row_nonbasic,
              (int)num_row_lower, (int)num_row_upper, (int)num_row_fixed,
              (int)num_row_free, (int)num_row_basic,
              (int)num_col_nonbasic + (int)num_row_nonbasic,
              (int)num_col_lower + (int)num_row_lower,
              (int)num_col_upper + (int)num_row_upper,
              (int)num_col_fixed + (int)num_row_fixed,
              (int)num_col_free + (int)num_row_free,
              (int)num_col_basic + (int)num_row_basic);
}